

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

void ipc_pipe_recv_start(ipc_pipe *p)

{
  nni_list *list;
  int iVar1;
  nni_aio *aio;
  undefined1 local_28 [8];
  nni_iov iov;
  
  if (p->rx_msg != (nni_msg *)0x0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc.c"
              ,0x211,"p->rx_msg == NULL");
  }
  list = &p->recv_q;
  if (p->closed == true) {
    aio = (nni_aio *)nni_list_first(list);
    while (aio != (nni_aio *)0x0) {
      nni_list_remove(list,aio);
      nni_aio_finish_error(aio,NNG_ECLOSED);
      aio = (nni_aio *)nni_list_first(list);
    }
  }
  else {
    iVar1 = nni_list_empty(list);
    if (iVar1 == 0) {
      local_28 = (undefined1  [8])p->rx_head;
      iov.iov_buf = (void *)0x9;
      nni_aio_set_iov(&p->rx_aio,1,(nni_iov *)local_28);
      nng_stream_recv(p->conn,&p->rx_aio);
    }
  }
  return;
}

Assistant:

static void
ipc_pipe_recv_start(ipc_pipe *p)
{
	nni_iov iov;
	NNI_ASSERT(p->rx_msg == NULL);

	if (p->closed) {
		nni_aio *aio;
		while ((aio = nni_list_first(&p->recv_q)) != NULL) {
			nni_list_remove(&p->recv_q, aio);
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
		return;
	}
	if (nni_list_empty(&p->recv_q)) {
		return;
	}

	// Schedule a read of the IPC header.
	iov.iov_buf = p->rx_head;
	iov.iov_len = sizeof(p->rx_head);
	nni_aio_set_iov(&p->rx_aio, 1, &iov);

	nng_stream_recv(p->conn, &p->rx_aio);
}